

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::calc_dpdt(PeleLM *this,Real time,Real dt,MultiFab *dpdt)

{
  double dVar1;
  StateData *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  TimeLevel TVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Geometry *this_02;
  long lVar10;
  Real RVar11;
  Real RVar12;
  double dVar13;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  dVar13 = p_amb_old;
  if (closed_chamber == 1) {
    this_00 = *(StateData **)
               ((long)(((((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
               + 0x170);
    RVar11 = amrex::StateData::prevTime(this_00);
    RVar12 = amrex::StateData::curTime(this_00);
    dVar13 = ((RVar12 - time) / (RVar12 - RVar11)) * p_amb_old +
             ((time - RVar11) / (RVar12 - RVar11)) * p_amb_new;
  }
  if ((0.0 < dt) && (0.0 < dpdt_factor)) {
    TVar2 = amrex::AmrLevel::which_time((AmrLevel *)this,0,time);
    this_01 = *(FabArray<amrex::FArrayBox> **)
               (&((this->super_NavierStokesBase).super_AmrLevel.state.
                  super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                  super__Vector_impl_data._M_start)->new_data + (TVar2 == AmrOldTime));
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)dpdt,true);
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::tilebox(&local_12c,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&dpdt->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,this_01,&mfi,RhoRT);
      RVar11 = dpdt_factor;
      lVar3 = (long)local_12c.smallend.vect[1];
      lVar6 = (long)local_12c.smallend.vect[2];
      lVar8 = (lVar3 - local_d0.begin.y) * local_d0.jstride * 8 +
              (lVar6 - local_d0.begin.z) * local_d0.kstride * 8 +
              (long)local_12c.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8 + (long)local_d0.p;
      lVar10 = (lVar3 - local_110.begin.y) * local_110.jstride * 8 +
               (lVar6 - local_110.begin.z) * local_110.kstride * 8 +
               (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 +
               (long)local_110.p;
      for (; lVar5 = lVar3, lVar7 = lVar8, lVar9 = lVar10, lVar6 <= local_12c.bigend.vect[2];
          lVar6 = lVar6 + 1) {
        for (; lVar5 <= local_12c.bigend.vect[1]; lVar5 = lVar5 + 1) {
          if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
            lVar4 = 0;
            do {
              dVar1 = *(double *)(lVar9 + lVar4 * 8);
              *(double *)(lVar7 + lVar4 * 8) = ((dVar1 - dVar13) / (dVar1 * dt)) * RVar11;
              lVar4 = lVar4 + 1;
            } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar4);
          }
          lVar7 = lVar7 + local_d0.jstride * 8;
          lVar9 = lVar9 + local_110.jstride * 8;
        }
        lVar8 = lVar8 + local_d0.kstride * 8;
        lVar10 = lVar10 + local_110.kstride * 8;
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    if (0 < (dpdt->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
      this_02 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
      mfi._0_12_ = amrex::Geometry::periodicity(this_02);
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                (&dpdt->super_FabArray<amrex::FArrayBox>,0,1,(Periodicity *)&mfi,false);
      amrex::Extrapolater::FirstOrderExtrap
                (dpdt,this_02,0,1,
                 (dpdt->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
    }
    return;
  }
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&dpdt->super_FabArray<amrex::FArrayBox>,0.0);
  return;
}

Assistant:

void
PeleLM::calc_dpdt (Real      time,
                   Real      dt,
                   MultiFab& dpdt)
{
    BL_PROFILE("PLM::calc_dpdt()");

    // for open chambers, ambient pressure is constant in time
    Real p_amb = p_amb_old;

    if (closed_chamber == 1)
    {
        // for closed chambers, use piecewise-linear interpolation
        // we need level 0 prev and tnp1 for closed chamber algorithm
        AmrLevel& amr_lev = parent->getLevel(0);
        StateData& state_data = amr_lev.get_state_data(0);
        const Real lev_0_prevtime = state_data.prevTime();
        const Real lev_0_curtime = state_data.curTime();

        // linearly interpolate from level 0 ambient pressure
        p_amb = (lev_0_curtime - time )/(lev_0_curtime-lev_0_prevtime) * p_amb_old +
                (time - lev_0_prevtime)/(lev_0_curtime-lev_0_prevtime) * p_amb_new;
    }

    if (dt <= 0.0 || dpdt_factor <= 0)
    {
        dpdt.setVal(0);
        return;
    }

    const TimeLevel whichTime = which_time(State_Type, time);
    AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);
    const MultiFab& S = (whichTime == AmrOldTime) ? get_old_data(State_Type) : get_new_data(State_Type);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dpdt,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& dPdt  = dpdt.array(mfi);
        auto const& P     = S.const_array(mfi,RhoRT);

        amrex::ParallelFor(bx, [dPdt, P, p_amb, dt, dpdt_fac = dpdt_factor]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           dPdt(i,j,k) = (P(i,j,k) - p_amb) / ( dt * P(i,j,k) ) * dpdt_fac;
        });
    }

    if (dpdt.nGrow() > 0) {
        dpdt.FillBoundary(0, 1, geom.periodicity());
        Extrapolater::FirstOrderExtrap(dpdt, geom, 0, 1, dpdt.nGrow());
    }
}